

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# d1_both.cc
# Opt level: O3

bool __thiscall
bssl::dtls1_process_handshake_fragments
          (bssl *this,SSL *ssl,uint8_t *out_alert,DTLSRecordNumber record_number,
          Span<const_unsigned_char> record)

{
  ushort uVar1;
  byte *pbVar2;
  _Head_base<0UL,_bssl::DTLSIncomingMessage_*,_false> __p_00;
  bool bVar3;
  uint16_t uVar4;
  int iVar5;
  size_t sVar6;
  ulong uVar7;
  uint uVar8;
  ulong start;
  ulong uVar9;
  undefined1 uVar10;
  int line;
  pointer __p;
  uint8_t *puVar11;
  ulong uVar12;
  OPENSSL_timeval now;
  hm_header_st msg_hdr;
  CBS cbs;
  ScopedCBB cbb;
  CBS body;
  _Head_base<0UL,_bssl::DTLSIncomingMessage_*,_false> local_d0;
  _Head_base<0UL,_bssl::DTLSIncomingMessage_*,_false> local_c8;
  hm_header_st local_bc;
  ulong local_a8;
  ulong local_a0;
  uint8_t *local_98;
  SSL *local_90;
  ulong local_88;
  CBS local_80;
  CBB local_70;
  CBS local_40;
  
  local_80.len = (size_t)record.data_;
  local_80.data = (uint8_t *)record_number.combined_;
  if ((uchar *)local_80.len != (uchar *)0x0) {
    local_88 = (ulong)out_alert >> 0x30;
    local_a0 = 0;
    local_a8 = 0;
    do {
      bVar3 = dtls1_parse_fragment(&local_80,&local_bc,&local_40);
      if (!bVar3) {
        ERR_put_error(0x10,0,0x6d,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/d1_both.cc"
                      ,0x108);
        uVar10 = 0x32;
        goto LAB_0016c0dd;
      }
      uVar9 = (ulong)local_bc.msg_len;
      start = (ulong)local_bc.frag_off;
      if ((local_bc.msg_len < local_bc.frag_off) ||
         (uVar12 = (ulong)local_bc.frag_len, uVar9 - start < uVar12)) {
        iVar5 = 0x6d;
        line = 0x111;
LAB_0016c0b2:
        ERR_put_error(0x10,0,iVar5,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/d1_both.cc"
                      ,line);
        uVar10 = 0x2f;
        goto LAB_0016c0dd;
      }
      pbVar2 = *(byte **)(this + 0x38);
      if ((*(ushort *)(pbVar2 + 4) <= local_bc.seq) && ((*pbVar2 & 0x10) == 0)) {
        if ((*(short *)(pbVar2 + 8) != (short)local_88) || (*(long *)(pbVar2 + 0x90) != 0)) {
          ERR_put_error(0x10,0,0xff,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/d1_both.cc"
                        ,0x126);
          uVar10 = 10;
          goto LAB_0016c0dd;
        }
        sVar6 = ssl_max_handshake_message_len((SSL *)this);
        if (sVar6 < uVar9) {
          iVar5 = 0x96;
          line = 300;
          goto LAB_0016c0b2;
        }
        iVar5 = SSL_in_init((SSL *)this);
        if ((iVar5 != 0) && (bVar3 = ssl_has_final_version((SSL *)this), bVar3)) {
          uVar4 = ssl_protocol_version((SSL *)this);
          local_a0 = CONCAT71((int7)(local_a0 >> 8),(byte)local_a0 | 0x303 < uVar4);
        }
        uVar1 = *(ushort *)(*(long *)(this + 0x38) + 4);
        iVar5 = (uint)local_bc.seq - (uint)uVar1;
        if (7 < iVar5) {
          local_a8 = CONCAT71((uint7)(byte)(local_bc.seq >> 8),1);
          goto LAB_0016bfbf;
        }
        uVar10 = 0x50;
        if ((local_bc.seq < uVar1) || (iVar5 == 7)) goto LAB_0016c0dd;
        uVar8 = (uint)local_bc.seq * 0x2493 >> 0x10;
        uVar8 = (((local_bc.seq - uVar8 & 0xffff) >> 1) + uVar8 >> 2) * -7 + (uint)local_bc.seq &
                0xffff;
        puVar11 = *(uint8_t **)(*(long *)(this + 0x38) + 0x118 + (ulong)uVar8 * 8);
        local_98 = out_alert;
        local_90 = ssl;
        if (puVar11 == (uint8_t *)0x0) {
          CBB_zero(&local_70);
          local_d0._M_head_impl = (DTLSIncomingMessage *)OPENSSL_malloc(0x30);
          if (local_d0._M_head_impl == (pointer)0x0) {
            local_d0._M_head_impl = (pointer)0x0;
LAB_0016beef:
            local_c8._M_head_impl = (pointer)0x0;
          }
          else {
            ((local_d0._M_head_impl)->reassembly).bytes_.size_ = 0;
            ((local_d0._M_head_impl)->reassembly).first_unmarked_byte_ = 0;
            ((local_d0._M_head_impl)->data).size_ = 0;
            ((local_d0._M_head_impl)->reassembly).bytes_.data_ = (uchar *)0x0;
            (local_d0._M_head_impl)->type = '\0';
            (local_d0._M_head_impl)->field_0x1 = 0;
            (local_d0._M_head_impl)->seq = 0;
            *(undefined4 *)&(local_d0._M_head_impl)->field_0x4 = 0;
            ((local_d0._M_head_impl)->data).data_ = (uchar *)0x0;
            (local_d0._M_head_impl)->type = local_bc.type;
            (local_d0._M_head_impl)->seq = local_bc.seq;
            bVar3 = Array<unsigned_char>::InitUninitialized
                              (&(local_d0._M_head_impl)->data,(ulong)(local_bc.msg_len + 0xc));
            if (((((!bVar3) ||
                  (iVar5 = CBB_init_fixed(&local_70,((local_d0._M_head_impl)->data).data_,0xc),
                  iVar5 == 0)) || (iVar5 = CBB_add_u8(&local_70,local_bc.type), iVar5 == 0)) ||
                (((iVar5 = CBB_add_u24(&local_70,local_bc.msg_len), iVar5 == 0 ||
                  (iVar5 = CBB_add_u16(&local_70,local_bc.seq), iVar5 == 0)) ||
                 ((iVar5 = CBB_add_u24(&local_70,0), iVar5 == 0 ||
                  ((iVar5 = CBB_add_u24(&local_70,local_bc.msg_len), iVar5 == 0 ||
                   (iVar5 = CBB_finish(&local_70,(uint8_t **)0x0,(size_t *)0x0), iVar5 == 0))))))))
               || (bVar3 = DTLSMessageBitmap::Init
                                     (&(local_d0._M_head_impl)->reassembly,(ulong)local_bc.msg_len),
                  !bVar3)) goto LAB_0016beef;
            local_c8._M_head_impl = local_d0._M_head_impl;
            local_d0._M_head_impl = (pointer)0x0;
          }
          __p_00._M_head_impl = local_c8._M_head_impl;
          std::unique_ptr<bssl::DTLSIncomingMessage,_bssl::internal::Deleter>::~unique_ptr
                    ((unique_ptr<bssl::DTLSIncomingMessage,_bssl::internal::Deleter> *)&local_d0);
          CBB_cleanup(&local_70);
          uVar7 = (ulong)(uVar8 << 3);
          local_c8._M_head_impl = (DTLSIncomingMessage *)0x0;
          std::__uniq_ptr_impl<bssl::DTLSIncomingMessage,_bssl::internal::Deleter>::reset
                    ((__uniq_ptr_impl<bssl::DTLSIncomingMessage,_bssl::internal::Deleter> *)
                     (*(long *)(this + 0x38) + uVar7 + 0x118),__p_00._M_head_impl);
          std::unique_ptr<bssl::DTLSIncomingMessage,_bssl::internal::Deleter>::~unique_ptr
                    ((unique_ptr<bssl::DTLSIncomingMessage,_bssl::internal::Deleter> *)&local_c8);
          puVar11 = *(uint8_t **)(*(long *)(this + 0x38) + 0x118 + uVar7);
          uVar10 = 0x50;
          ssl = local_90;
          if (puVar11 == (uint8_t *)0x0) {
LAB_0016c0dd:
            *(undefined1 *)&ssl->method = uVar10;
            return false;
          }
          uVar7 = *(ulong *)(puVar11 + 0x10);
          if (uVar7 < 0xc) {
LAB_0016c12d:
            abort();
          }
        }
        else {
          if (*(ushort *)(puVar11 + 2) != local_bc.seq) {
            __assert_fail("frag->seq == msg_hdr->seq",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/d1_both.cc"
                          ,0xe8,
                          "DTLSIncomingMessage *bssl::dtls1_get_incoming_message(SSL *, uint8_t *, const struct hm_header_st *)"
                         );
          }
          if (*puVar11 != local_bc.type) {
LAB_0016c112:
            iVar5 = 0x98;
            line = 0xed;
            goto LAB_0016c0b2;
          }
          uVar7 = *(ulong *)(puVar11 + 0x10);
          if (uVar7 < 0xc) goto LAB_0016c12d;
          if (uVar7 - 0xc != (ulong)local_bc.msg_len) goto LAB_0016c112;
        }
        ssl = local_90;
        if (uVar7 - 0xc != uVar9) {
          __assert_fail("frag->msg_len() == msg_len",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/d1_both.cc"
                        ,0x14a,
                        "bool bssl::dtls1_process_handshake_fragments(SSL *, uint8_t *, DTLSRecordNumber, Span<const uint8_t>)"
                       );
        }
        out_alert = local_98;
        if (*(long *)(puVar11 + 0x20) != 0) {
          if (uVar9 == 0) {
            __assert_fail("msg_len > 0",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/d1_both.cc"
                          ,0x150,
                          "bool bssl::dtls1_process_handshake_fragments(SSL *, uint8_t *, DTLSRecordNumber, Span<const uint8_t>)"
                         );
          }
          if (local_40.len != 0) {
            memcpy((void *)(*(long *)(puVar11 + 8) + start + 0xc),local_40.data,local_40.len);
          }
          DTLSMessageBitmap::MarkRange((DTLSMessageBitmap *)(puVar11 + 0x18),start,uVar12 + start);
          out_alert = local_98;
        }
      }
LAB_0016bfbf:
    } while ((uchar *)local_80.len != (uchar *)0x0);
    if ((local_a0 & 1) != 0) {
      dtls1_stop_timer((SSL *)this);
      dtls_clear_outgoing_messages((SSL *)this);
    }
    if ((local_a8 & 1) != 0) {
      return true;
    }
  }
  MRUQueue<bssl::DTLSRecordNumber,_32UL>::PushBack
            ((MRUQueue<bssl::DTLSRecordNumber,_32UL> *)(*(long *)(this + 0x38) + 0x2b0),
             (DTLSRecordNumber)out_alert);
  bVar3 = ssl_has_final_version((SSL *)this);
  if ((((bVar3) && (uVar4 = ssl_protocol_version((SSL *)this), 0x303 < uVar4)) &&
      (bVar3 = DTLSTimer::IsSet((DTLSTimer *)(*(long *)(this + 0x38) + 0x3e0)), !bVar3)) &&
     ((**(byte **)(this + 0x38) & 0x40) == 0)) {
    now = ssl_ctx_get_current_time(*(SSL_CTX **)(this + 0x68));
    DTLSTimer::StartMicroseconds
              ((DTLSTimer *)(*(long *)(this + 0x38) + 0x3e0),now,
               (ulong)*(uint *)(*(long *)(this + 0x38) + 0x3f0) * 0xfa);
  }
  return true;
}

Assistant:

bool dtls1_process_handshake_fragments(SSL *ssl, uint8_t *out_alert,
                                       DTLSRecordNumber record_number,
                                       Span<const uint8_t> record) {
  bool implicit_ack = false;
  bool skipped_fragments = false;
  CBS cbs = record;
  while (CBS_len(&cbs) > 0) {
    // Read a handshake fragment.
    struct hm_header_st msg_hdr;
    CBS body;
    if (!dtls1_parse_fragment(&cbs, &msg_hdr, &body)) {
      OPENSSL_PUT_ERROR(SSL, SSL_R_BAD_HANDSHAKE_RECORD);
      *out_alert = SSL_AD_DECODE_ERROR;
      return false;
    }

    const size_t frag_off = msg_hdr.frag_off;
    const size_t frag_len = msg_hdr.frag_len;
    const size_t msg_len = msg_hdr.msg_len;
    if (frag_off > msg_len || frag_len > msg_len - frag_off) {
      OPENSSL_PUT_ERROR(SSL, SSL_R_BAD_HANDSHAKE_RECORD);
      *out_alert = SSL_AD_ILLEGAL_PARAMETER;
      return false;
    }

    if (msg_hdr.seq < ssl->d1->handshake_read_seq ||
        ssl->d1->handshake_read_overflow) {
      // Ignore fragments from the past. This is a retransmit of data we already
      // received.
      //
      // TODO(crbug.com/42290594): Use this to drive retransmits.
      continue;
    }

    if (record_number.epoch() != ssl->d1->read_epoch.epoch ||
        ssl->d1->next_read_epoch != nullptr) {
      // New messages can only arrive in the latest epoch. This can fail if the
      // record came from |prev_read_epoch|, or if it came from |read_epoch| but
      // |next_read_epoch| exists. (It cannot come from |next_read_epoch|
      // because |next_read_epoch| becomes |read_epoch| once it receives a
      // record.)
      OPENSSL_PUT_ERROR(SSL, SSL_R_EXCESS_HANDSHAKE_DATA);
      *out_alert = SSL_AD_UNEXPECTED_MESSAGE;
      return false;
    }

    if (msg_len > ssl_max_handshake_message_len(ssl)) {
      OPENSSL_PUT_ERROR(SSL, SSL_R_EXCESSIVE_MESSAGE_SIZE);
      *out_alert = SSL_AD_ILLEGAL_PARAMETER;
      return false;
    }

    if (SSL_in_init(ssl) && ssl_has_final_version(ssl) &&
        ssl_protocol_version(ssl) >= TLS1_3_VERSION) {
      // During the handshake, if we receive any portion of the next flight, the
      // peer must have received our most recent flight. In DTLS 1.3, this is an
      // implicit ACK. See RFC 9147, Section 7.1.
      //
      // This only applies during the handshake. After the handshake, the next
      // message may be part of a post-handshake transaction. It also does not
      // apply immediately after the handshake. As a client, receiving a
      // KeyUpdate or NewSessionTicket does not imply the server has received
      // our Finished. The server may have sent those messages in half-RTT.
      implicit_ack = true;
    }

    if (msg_hdr.seq - ssl->d1->handshake_read_seq > SSL_MAX_HANDSHAKE_FLIGHT) {
      // Ignore fragments too far in the future.
      skipped_fragments = true;
      continue;
    }

    DTLSIncomingMessage *frag =
        dtls1_get_incoming_message(ssl, out_alert, &msg_hdr);
    if (frag == nullptr) {
      return false;
    }
    assert(frag->msg_len() == msg_len);

    if (frag->reassembly.IsComplete()) {
      // The message is already assembled.
      continue;
    }
    assert(msg_len > 0);

    // Copy the body into the fragment.
    Span<uint8_t> dest = frag->msg().subspan(frag_off, CBS_len(&body));
    OPENSSL_memcpy(dest.data(), CBS_data(&body), CBS_len(&body));
    frag->reassembly.MarkRange(frag_off, frag_off + frag_len);
  }

  if (implicit_ack) {
    dtls1_stop_timer(ssl);
    dtls_clear_outgoing_messages(ssl);
  }

  if (!skipped_fragments) {
    ssl->d1->records_to_ack.PushBack(record_number);

    if (ssl_has_final_version(ssl) &&
        ssl_protocol_version(ssl) >= TLS1_3_VERSION &&
        !ssl->d1->ack_timer.IsSet() && !ssl->d1->sending_ack) {
      // Schedule sending an ACK. The delay serves several purposes:
      // - If there are more records to come, we send only one ACK.
      // - If there are more records to come and the flight is now complete, we
      //   will send the reply (which implicitly ACKs the previous flight) and
      //   cancel the timer.
      // - If there are more records to come, the flight is now complete, but
      //   generating the response is delayed (e.g. a slow, async private key),
      //   the timer will fire and we send an ACK anyway.
      OPENSSL_timeval now = ssl_ctx_get_current_time(ssl->ctx.get());
      ssl->d1->ack_timer.StartMicroseconds(
          now, uint64_t{ssl->d1->timeout_duration_ms} * 1000 / 4);
    }
  }

  return true;
}